

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataModel.cpp
# Opt level: O2

void __thiscall Rml::DataModel::DataModel(DataModel *this,DataTypeRegister *data_type_register)

{
  size_t *psVar1;
  _Head_base<0UL,_Rml::DataViews_*,_false> _Var2;
  _Head_base<0UL,_Rml::DataViews_*,_false> local_48 [3];
  
  psVar1 = &(this->variables).mMask;
  (this->views)._M_t.super___uniq_ptr_impl<Rml::DataViews,_std::default_delete<Rml::DataViews>_>.
  _M_t.super__Tuple_impl<0UL,_Rml::DataViews_*,_std::default_delete<Rml::DataViews>_>.
  super__Head_base<0UL,_Rml::DataViews_*,_false>._M_head_impl = (DataViews *)0x0;
  (this->controllers)._M_t.
  super___uniq_ptr_impl<Rml::DataControllers,_std::default_delete<Rml::DataControllers>_>._M_t.
  super__Tuple_impl<0UL,_Rml::DataControllers_*,_std::default_delete<Rml::DataControllers>_>.
  super__Head_base<0UL,_Rml::DataControllers_*,_false>._M_head_impl = (DataControllers *)0x0;
  (this->variables).mKeyVals = (Node *)psVar1;
  (this->variables).mInfo = (uint8_t *)psVar1;
  (this->variables).mMaxNumElementsAllowed = 0;
  (this->variables).mNumElements = 0;
  (this->variables).mMask = 0;
  (this->variables).mInfoInc = 0x20;
  psVar1 = &(this->function_variable_definitions).mMask;
  *(undefined8 *)&(this->variables).mInfoHashShift = 0;
  *(undefined8 *)
   ((long)&(this->dirty_variables).m_container.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start + 4) = 0;
  (this->dirty_variables).m_container.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->dirty_variables).m_container.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->function_variable_definitions).mKeyVals = (Node *)psVar1;
  (this->function_variable_definitions).mInfo = (uint8_t *)psVar1;
  (this->function_variable_definitions).mNumElements = 0;
  (this->function_variable_definitions).mMask = 0;
  (this->function_variable_definitions).mMaxNumElementsAllowed = 0;
  (this->function_variable_definitions).mInfoInc = 0x20;
  (this->function_variable_definitions).mInfoHashShift = 0;
  psVar1 = &(this->event_callbacks).mMask;
  (this->event_callbacks).mKeyVals = (Node *)psVar1;
  (this->event_callbacks).mInfo = (uint8_t *)psVar1;
  (this->event_callbacks).mMaxNumElementsAllowed = 0;
  (this->event_callbacks).mNumElements = 0;
  (this->event_callbacks).mMask = 0;
  (this->event_callbacks).mInfoInc = 0x20;
  (this->event_callbacks).mInfoHashShift = 0;
  psVar1 = &(this->aliases).mMask;
  (this->aliases).mKeyVals = (Node *)psVar1;
  (this->aliases).mInfo = (uint8_t *)psVar1;
  (this->aliases).mMaxNumElementsAllowed = 0;
  (this->aliases).mNumElements = 0;
  (this->aliases).mMask = 0;
  (this->aliases).mInfoInc = 0x20;
  (this->aliases).mInfoHashShift = 0;
  this->data_type_register = data_type_register;
  (this->attached_elements).m_container.
  super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->attached_elements).m_container.
  super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->attached_elements).m_container.
  super__Vector_base<Rml::Element_*,_std::allocator<Rml::Element_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::make_unique<Rml::DataViews>();
  _Var2._M_head_impl = local_48[0]._M_head_impl;
  local_48[0]._M_head_impl = (DataViews *)0x0;
  ::std::__uniq_ptr_impl<Rml::DataViews,_std::default_delete<Rml::DataViews>_>::reset
            ((__uniq_ptr_impl<Rml::DataViews,_std::default_delete<Rml::DataViews>_> *)this,
             _Var2._M_head_impl);
  ::std::unique_ptr<Rml::DataViews,_std::default_delete<Rml::DataViews>_>::~unique_ptr
            ((unique_ptr<Rml::DataViews,_std::default_delete<Rml::DataViews>_> *)local_48);
  ::std::make_unique<Rml::DataControllers>();
  _Var2._M_head_impl = local_48[0]._M_head_impl;
  local_48[0]._M_head_impl = (DataViews *)0x0;
  ::std::__uniq_ptr_impl<Rml::DataControllers,_std::default_delete<Rml::DataControllers>_>::reset
            ((__uniq_ptr_impl<Rml::DataControllers,_std::default_delete<Rml::DataControllers>_> *)
             &this->controllers,(pointer)_Var2._M_head_impl);
  ::std::unique_ptr<Rml::DataControllers,_std::default_delete<Rml::DataControllers>_>::~unique_ptr
            ((unique_ptr<Rml::DataControllers,_std::default_delete<Rml::DataControllers>_> *)
             local_48);
  return;
}

Assistant:

DataModel::DataModel(DataTypeRegister* data_type_register) : data_type_register(data_type_register)
{
	views = MakeUnique<DataViews>();
	controllers = MakeUnique<DataControllers>();
}